

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::AnnualTimeZoneRule::getStartInYear
          (AnnualTimeZoneRule *this,int32_t year,int32_t prevRawOffset,int32_t prevDSTSavings,
          UDate *result)

{
  DateTimeRule *this_00;
  bool bVar1;
  int iVar2;
  UBool UVar3;
  int8_t iVar4;
  DateRuleType DVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t month;
  int iVar8;
  TimeRuleType TVar9;
  int iVar10;
  bool bVar11;
  double local_38;
  
  if (year < this->fStartYear) {
    return '\0';
  }
  if (this->fEndYear < year) {
    return '\0';
  }
  DVar5 = DateTimeRule::getDateRuleType(this->fDateTimeRule);
  this_00 = this->fDateTimeRule;
  if (DVar5 == DOW) {
    iVar6 = DateTimeRule::getRuleWeekInMonth(this_00);
    iVar7 = DateTimeRule::getRuleMonth(this->fDateTimeRule);
    if (iVar6 < 1) {
      month = DateTimeRule::getRuleMonth(this->fDateTimeRule);
      iVar4 = Grego::monthLength(year,month);
      local_38 = Grego::fieldsToDay(year,iVar7,(int)iVar4);
      local_38 = (double)(iVar6 * 7 + 7) + local_38;
      bVar11 = true;
    }
    else {
      local_38 = Grego::fieldsToDay(year,iVar7,1);
      local_38 = (double)(iVar6 * 7 + -7) + local_38;
      bVar11 = false;
    }
  }
  else {
    if (DVar5 == DOM) {
      iVar6 = DateTimeRule::getRuleMonth(this_00);
      iVar7 = DateTimeRule::getRuleDayOfMonth(this->fDateTimeRule);
      local_38 = Grego::fieldsToDay(year,iVar6,iVar7);
      goto LAB_0020e1a8;
    }
    iVar6 = DateTimeRule::getRuleMonth(this_00);
    iVar7 = DateTimeRule::getRuleDayOfMonth(this->fDateTimeRule);
    bVar11 = DVar5 == DOW_LEQ_DOM;
    if ((bVar11) && (iVar7 == 0x1d && iVar6 == 1)) {
      UVar3 = Grego::isLeapYear(year);
      iVar7 = 0x1d - (uint)(UVar3 == '\0');
    }
    local_38 = Grego::fieldsToDay(year,iVar6,iVar7);
  }
  iVar6 = Grego::dayOfWeek(local_38);
  iVar7 = DateTimeRule::getRuleDayOfWeek(this->fDateTimeRule);
  iVar8 = iVar7 - iVar6;
  bVar1 = iVar8 < 0;
  iVar2 = 7;
  if (bVar11) {
    bVar1 = 0 < iVar8;
    iVar2 = -7;
  }
  iVar10 = 0;
  if (bVar1) {
    iVar10 = iVar2;
  }
  local_38 = (double)(iVar10 + iVar8) + local_38;
LAB_0020e1a8:
  iVar6 = DateTimeRule::getRuleMillisInDay(this->fDateTimeRule);
  *result = local_38 * 86400000.0 + (double)iVar6;
  TVar9 = DateTimeRule::getTimeRuleType(this->fDateTimeRule);
  if (TVar9 != UTC_TIME) {
    *result = *result - (double)prevRawOffset;
  }
  TVar9 = DateTimeRule::getTimeRuleType(this->fDateTimeRule);
  if (TVar9 == WALL_TIME) {
    *result = *result - (double)prevDSTSavings;
  }
  return '\x01';
}

Assistant:

UBool
AnnualTimeZoneRule::getStartInYear(int32_t year,
                                   int32_t prevRawOffset,
                                   int32_t prevDSTSavings,
                                   UDate &result) const {
    if (year < fStartYear || year > fEndYear) {
        return FALSE;
    }
    double ruleDay;
    DateTimeRule::DateRuleType type = fDateTimeRule->getDateRuleType();
    if (type == DateTimeRule::DOM) {
        ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(), fDateTimeRule->getRuleDayOfMonth());
    } else {
        UBool after = TRUE;
        if (type == DateTimeRule::DOW) {
            // Normalize DOW rule into DOW_GEQ_DOM or DOW_LEQ_DOM
            int32_t weeks = fDateTimeRule->getRuleWeekInMonth();
            if (weeks > 0) {
                ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(), 1);
                ruleDay += 7 * (weeks - 1);
            } else {
                after = FALSE;
                ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(),
                    Grego::monthLength(year, fDateTimeRule->getRuleMonth()));
                ruleDay += 7 * (weeks + 1);
           }
        } else {
            int32_t month = fDateTimeRule->getRuleMonth();
            int32_t dom = fDateTimeRule->getRuleDayOfMonth();
            if (type == DateTimeRule::DOW_LEQ_DOM) {
                after = FALSE;
                // Handle Feb <=29
                if (month == UCAL_FEBRUARY && dom == 29 && !Grego::isLeapYear(year)) {
                    dom--;
                }
            }
            ruleDay = Grego::fieldsToDay(year, month, dom);
        }
        int32_t dow = Grego::dayOfWeek(ruleDay);
        int32_t delta = fDateTimeRule->getRuleDayOfWeek() - dow;
        if (after) {
            delta = delta < 0 ? delta + 7 : delta;
        } else {
            delta = delta > 0 ? delta - 7 : delta;
        }
        ruleDay += delta;
    }

    result = ruleDay*U_MILLIS_PER_DAY + fDateTimeRule->getRuleMillisInDay();
    if (fDateTimeRule->getTimeRuleType() != DateTimeRule::UTC_TIME) {
        result -= prevRawOffset;
    }
    if (fDateTimeRule->getTimeRuleType() == DateTimeRule::WALL_TIME) {
        result -= prevDSTSavings;
    }
    return TRUE;
}